

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_tests.cc
# Opt level: O0

void __thiscall PointTest_Distance_Test::TestBody(PointTest_Distance_Test *this)

{
  bool bVar1;
  char *message;
  double dVar2;
  AssertHelper local_70;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  point_t p3;
  point_t p2;
  point_t p1;
  PointTest_Distance_Test *this_local;
  
  point_init((point_t *)&p2.y,3.0,0.0);
  point_init((point_t *)&p3.y,0.0,4.0);
  dVar2 = point_distance((point_t *)&p2.y,(point_t *)&p3.y);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_50,"point_distance(&p1, &p2)","5.0",(float)dVar2,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/simple_adt/point_tests.cc"
               ,0x2e,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  return;
}

Assistant:

TEST(PointTest, Distance)
{
    point_t p1, p2, p3;

    point_init(&p1, 3, 0);
    point_init(&p2, 0, 4);
    ASSERT_FLOAT_EQ( point_distance(&p1, &p2), 5.0);
}